

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O2

int duckdb::DeltaDecode<int>(int *data,int previous_value,size_t size)

{
  int iVar1;
  ulong uVar2;
  int iVar3;
  
  iVar3 = previous_value + *data;
  *data = iVar3;
  if (size < 4) {
    uVar2 = 1;
  }
  else {
    for (uVar2 = 1; uVar2 < (size & 0xfffffffffffffffc) - 4; uVar2 = uVar2 + 4) {
      iVar1 = data[uVar2];
      data[uVar2] = iVar3 + iVar1;
      iVar3 = iVar3 + iVar1 + data[uVar2 + 1];
      data[uVar2 + 1] = iVar3;
      iVar3 = iVar3 + data[uVar2 + 2];
      data[uVar2 + 2] = iVar3;
      iVar3 = iVar3 + data[uVar2 + 3];
      data[uVar2 + 3] = iVar3;
    }
  }
  for (; size != uVar2; uVar2 = uVar2 + 1) {
    data[uVar2] = data[uVar2] + data[uVar2 - 1];
  }
  return (int)uVar2;
}

Assistant:

static T DeltaDecode(T *data, T previous_value, const size_t size) {
	D_ASSERT(size >= 1);

	data[0] += previous_value;

	const size_t UnrollQty = 4;
	const size_t sz0 = (size / UnrollQty) * UnrollQty; // equal to 0, if size < UnrollQty
	size_t i = 1;
	if (sz0 >= UnrollQty) {
		T a = data[0];
		for (; i < sz0 - UnrollQty; i += UnrollQty) {
			a = data[i] += a;
			a = data[i + 1] += a;
			a = data[i + 2] += a;
			a = data[i + 3] += a;
		}
	}
	for (; i != size; ++i) {
		data[i] += data[i - 1];
	}

	return data[size - 1];
}